

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  IfcStructuralSurfaceConnection *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcStructuralConnection).field_0x140,
             "IfcStructuralSurfaceConnection");
  IfcStructuralConnection::IfcStructuralConnection
            (&this->super_IfcStructuralConnection,&PTR_construction_vtable_24__00f71830);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL> *)
             &(this->super_IfcStructuralConnection).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20,
             &PTR_construction_vtable_24__00f71968);
  *(undefined8 *)&this->super_IfcStructuralConnection = 0xf71700;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0xf71818;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0xf71728;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0xf71750;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0xd0 = 0xf71778;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x100 = 0xf717a0;
  (this->super_IfcStructuralConnection).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf717c8;
  *(undefined8 *)
   &(this->super_IfcStructuralConnection).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20 = 0xf717f0;
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}